

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip.hpp
# Opt level: O2

void toml::detail::skip_inline_table_like<toml::type_config>
               (location *loc,context<toml::type_config> *ctx)

{
  element_type *peVar1;
  char_type_conflict cVar2;
  sequence local_188;
  sequence local_168;
  location checkpoint;
  region local_100;
  region local_98;
  
  location::advance(loc,1);
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          peVar1 = (loc->source_).
                   super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          if ((ulong)((long)(peVar1->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(peVar1->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start) <= loc->location_) {
            return;
          }
          cVar2 = location::current(loc);
          if ((cVar2 == '\n') && ((ctx->toml_spec_).v1_1_0_allow_newlines_in_inline_tables != true))
          {
            return;
          }
          cVar2 = location::current(loc);
          if ((cVar2 != '\"') && (cVar2 = location::current(loc), cVar2 != '\'')) break;
          skip_string_like<toml::type_config>(loc,ctx);
        }
        cVar2 = location::current(loc);
        if (cVar2 != '#') break;
        skip_comment_block<toml::type_config>(loc,ctx);
        if ((ctx->toml_spec_).v1_1_0_allow_newlines_in_inline_tables == false) {
          return;
        }
      }
      cVar2 = location::current(loc);
      if (cVar2 == '[') break;
      cVar2 = location::current(loc);
      if (cVar2 == '{') {
        skip_inline_table_like<toml::type_config>(loc,ctx);
      }
      else {
        cVar2 = location::current(loc);
        if (cVar2 == '}') {
          return;
        }
        location::advance(loc,1);
      }
    }
    location::location(&checkpoint,loc);
    syntax::std_table(&local_188,&ctx->toml_spec_);
    sequence::scan(&local_100,&local_188,loc);
    if (local_100.source_.
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != (element_type *)0x0) break;
    syntax::array_table(&local_168,&ctx->toml_spec_);
    sequence::scan(&local_98,&local_168,loc);
    peVar1 = local_98.source_.
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    region::~region(&local_98);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector(&local_168.others_);
    region::~region(&local_100);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector(&local_188.others_);
    if (peVar1 != (element_type *)0x0) goto LAB_00349513;
    skip_array_like<toml::type_config>(loc,ctx);
    location::~location(&checkpoint);
  }
  region::~region(&local_100);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_188.others_);
LAB_00349513:
  location::operator=(loc,&checkpoint);
  location::~location(&checkpoint);
  return;
}

Assistant:

void skip_inline_table_like(location& loc, const context<TC>& ctx)
{
    assert(loc.current() == '{');
    loc.advance();

    const auto& spec = ctx.toml_spec();

    while( ! loc.eof())
    {
        if(loc.current() == '\n' && ! spec.v1_1_0_allow_newlines_in_inline_tables)
        {
            break; // missing closing `}`.
        }
        else if(loc.current() == '\"' || loc.current() == '\'')
        {
            skip_string_like(loc, ctx);
        }
        else if(loc.current() == '#')
        {
            skip_comment_block(loc, ctx);
            if( ! spec.v1_1_0_allow_newlines_in_inline_tables)
            {
                // comment must end with newline.
                break; // missing closing `}`.
            }
        }
        else if(loc.current() == '[')
        {
            const auto checkpoint = loc;
            if(syntax::std_table(spec).scan(loc).is_ok() ||
               syntax::array_table(spec).scan(loc).is_ok())
            {
                loc = checkpoint;
                break; // missing closing `}`.
            }
            // if it is not a table-definition, then it is an array.
            skip_array_like(loc, ctx);
        }
        else if(loc.current() == '{')
        {
            skip_inline_table_like(loc, ctx);
        }
        else if(loc.current() == '}')
        {
            // closing brace found. guessing the error is inside the table.
            break;
        }
        else
        {
            // skip otherwise.
            loc.advance();
        }
    }
    return ;
}